

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O3

UINT8 DataLoader_Reset(DATA_LOADER *loader)

{
  UINT8 UVar1;
  
  if (loader->_status != '\0') {
    if (loader->_status == '\x01') {
      UVar1 = (*loader->_callbacks->dclose)(loader->_context);
      if (UVar1 == '\0') {
        loader->_status = '\x02';
      }
    }
    if (loader->_data != (UINT8 *)0x0) {
      free(loader->_data);
      loader->_data = (UINT8 *)0x0;
      loader->_bytesLoaded = 0;
    }
    loader->_status = '\0';
    return '\0';
  }
  return '\x01';
}

Assistant:

UINT8 DataLoader_Reset(DATA_LOADER *loader)
{
	if (loader->_status == DLSTAT_EMPTY) return 1;

	DataLoader_CancelLoading(loader);

	if(loader->_data) {
		free(loader->_data);
		loader->_data = NULL;
		loader->_bytesLoaded = 0;
	}

	loader->_status = DLSTAT_EMPTY;

	return 0;
}